

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::AtomTypesSectionParser::parseLine
          (AtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  AtomType *pAVar4;
  AtomType *this_00;
  ostream *poVar5;
  RealType m;
  string atomTypeName;
  string baseAtomTypeName;
  StringTokenizer tokenizer;
  string local_c0;
  string local_a0;
  StringTokenizer local_80;
  
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  iVar3 = StringTokenizer::countTokens(&local_80);
  if (iVar3 < 2) {
    snprintf(painCave.errMsg,2000,"AtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_c0,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_a0,&local_80);
    pAVar4 = ForceField::getAtomType(ff,&local_a0);
    if (pAVar4 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "AtomTypesSectionParser Error: Could not find matching base atom type to %s at line %d\n"
               ,local_a0._M_dataplus._M_p,(ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    this_00 = ForceField::getAtomType(ff,&local_c0);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      (*this_00->_vptr_AtomType[2])(this_00,pAVar4);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
      AtomType::setName(this_00,&local_c0);
      ForceField::addAtomType(ff,&local_c0,this_00);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"duplicate atom type: ",0x15);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_c0._M_dataplus._M_p,local_c0._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," on line ",9);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,lineNo);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    bVar2 = StringTokenizer::hasMoreTokens(&local_80);
    if (bVar2) {
      m = StringTokenizer::nextTokenAsDouble(&local_80);
      AtomType::setMass(this_00,m);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AtomTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in AtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "AtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string baseAtomTypeName = tokenizer.nextToken();

      AtomType* baseAtomType =
          dynamic_cast<AtomType*>(ff.getAtomType(baseAtomTypeName));

      if (baseAtomType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "AtomTypesSectionParser Error: Could not find matching base atom "
            "type to "
            "%s at line %d\n",
            baseAtomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      AtomType* atomType = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        atomType = new AtomType();
        atomType->useBase(baseAtomType);
        int ident = ff.getNAtomType();
        atomType->setIdent(ident);
        atomType->setName(atomTypeName);
        ff.addAtomType(atomTypeName, atomType);
      } else {
        std::cerr << "duplicate atom type: " << atomTypeName << " on line "
                  << lineNo << "\n";
      }

      if (tokenizer.hasMoreTokens()) {
        RealType mass = tokenizer.nextTokenAsDouble();
        atomType->setMass(mass);
      }
    }
  }